

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

Type * __thiscall
soul::heart::Parser::parseVectorOrArrayTypeSuffixes
          (Type *__return_storage_ptr__,Parser *this,PrimitiveType *elementType)

{
  bool bVar1;
  PrimitiveType local_f4;
  Type local_f0;
  PrimitiveType local_d4;
  Type local_d0;
  CompileMessage local_b8;
  char *local_80;
  ArraySize local_78;
  int64_t size;
  CompileMessage local_60;
  char *local_28;
  PrimitiveType *local_20;
  PrimitiveType *elementType_local;
  Parser *this_local;
  
  local_28 = "<";
  local_20 = elementType;
  elementType_local = (PrimitiveType *)this;
  this_local = (Parser *)__return_storage_ptr__;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x54e539);
  if (bVar1) {
    bVar1 = PrimitiveType::canBeVectorElementType(elementType);
    if (!bVar1) {
      Errors::wrongTypeForArrayElement<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_60);
      CompileMessage::~CompileMessage(&local_60);
    }
    local_78 = parseLiteralInt(this);
    local_80 = ">";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x574319);
    bVar1 = Type::isLegalVectorSize(local_78);
    if (!bVar1) {
      Errors::illegalVectorSize<>();
      (*(this->
        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        )._vptr_Tokeniser[2])(this,&local_b8);
      CompileMessage::~CompileMessage(&local_b8);
    }
    PrimitiveType::PrimitiveType(&local_d4,elementType);
    Type::createVector(&local_d0,&local_d4,local_78);
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_d0);
    Type::~Type(&local_d0);
  }
  else {
    PrimitiveType::PrimitiveType(&local_f4,elementType);
    Type::Type(&local_f0,&local_f4);
    parseArrayTypeSuffixes(__return_storage_ptr__,this,&local_f0);
    Type::~Type(&local_f0);
  }
  return __return_storage_ptr__;
}

Assistant:

Type parseVectorOrArrayTypeSuffixes (PrimitiveType elementType)
    {
        if (matchIf (HEARTOperator::lessThan))
        {
            if (! elementType.canBeVectorElementType())
                throwError (Errors::wrongTypeForArrayElement());

            auto size = parseLiteralInt();
            expect (HEARTOperator::greaterThan);

            if (! Type::isLegalVectorSize (size))
                throwError (Errors::illegalVectorSize());

            return parseArrayTypeSuffixes (Type::createVector (elementType, static_cast<Type::ArraySize> (size)));
        }

        return parseArrayTypeSuffixes (elementType);
    }